

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void __thiscall
testing::internal::linked_ptr<testing::internal::ExpectationBase>::linked_ptr
          (linked_ptr<testing::internal::ExpectationBase> *this,
          linked_ptr<testing::internal::ExpectationBase> *ptr)

{
  linked_ptr<testing::internal::ExpectationBase> *ptr_local;
  linked_ptr<testing::internal::ExpectationBase> *this_local;
  
  if (ptr != this) {
    copy<testing::internal::ExpectationBase>(this,ptr);
    return;
  }
  __assert_fail("&ptr != this",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/libs/gmock-gtest/./gtest/gtest.h"
                ,0x2101,
                "testing::internal::linked_ptr<testing::internal::ExpectationBase>::linked_ptr(const linked_ptr<T> &) [T = testing::internal::ExpectationBase]"
               );
}

Assistant:

linked_ptr(linked_ptr const& ptr) {  // NOLINT
    assert(&ptr != this);
    copy(&ptr);
  }